

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O3

void __thiscall sc_core::sc_event::trigger(sc_event *this)

{
  pointer ppsVar1;
  sc_method_handle this_00;
  sc_runnable *psVar2;
  pointer ppsVar3;
  sc_thread_handle this_01;
  bool bVar4;
  ulong uVar5;
  sc_simcontext *psVar6;
  int iVar7;
  long lVar8;
  sc_method_handle *l_methods_dynamic;
  int iVar9;
  int iVar10;
  
  ppsVar1 = (this->m_methods_static).
            super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->m_trigger_stamp = this->m_simc->m_change_stamp;
  this->m_notify_type = NONE;
  this->m_delta_event_index = -1;
  this->m_timed = (sc_event_timed *)0x0;
  uVar5 = (long)(this->m_methods_static).
                super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar1;
  if ((uVar5 & 0x7fffffff8) != 0) {
    lVar8 = (long)(int)(uVar5 >> 3) + 1;
    do {
      this_00 = ppsVar1[lVar8 + -2];
      if ((((*(byte *)((long)(&(this_00->super_sc_process_b).super_sc_object + 2) + 0x38) & 1) == 0)
          && (*(long *)((long)(&(this_00->super_sc_process_b).super_sc_object + 2) + 0x18) == 0)) &&
         (*(trigger_t *)((long)(&(this_00->super_sc_process_b).super_sc_object + 3) + 0x10) ==
          STATIC)) {
        if (sc_curr_simcontext == (sc_simcontext *)0x0) {
          psVar6 = (sc_simcontext *)operator_new(0x168);
          sc_simcontext::sc_simcontext(psVar6);
          sc_curr_simcontext = psVar6;
          sc_default_global_context = psVar6;
        }
        if ((sc_method_handle)(sc_curr_simcontext->m_curr_proc_info).process_handle == this_00) {
          sc_process_b::report_immediate_self_notification(&this_00->super_sc_process_b);
        }
        else if ((*(uint *)((long)(&(this_00->super_sc_process_b).super_sc_object + 2) + 0x38) & 4)
                 == 0) {
          psVar2 = ((this_00->super_sc_process_b).super_sc_object.m_simc)->m_runnable;
          (this_00->super_sc_process_b).m_runnable_p = (sc_process_b *)0xdb;
          (psVar2->m_methods_push_tail->super_sc_process_b).m_runnable_p =
               &this_00->super_sc_process_b;
          psVar2->m_methods_push_tail = this_00;
        }
        else {
          (this_00->super_sc_process_b).m_state =
               *(uint *)((long)(&(this_00->super_sc_process_b).super_sc_object + 2) + 0x38) | 2;
        }
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  ppsVar1 = (this->m_methods_dynamic).
            super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar10 = (int)((ulong)((long)(this->m_methods_dynamic).
                               super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar1) >> 3);
  if (iVar10 != 0) {
    if (0 < iVar10) {
      iVar10 = iVar10 + -1;
      iVar9 = 0;
      do {
        bVar4 = sc_method_process::trigger_dynamic(ppsVar1[iVar9],this);
        iVar7 = iVar9;
        if (bVar4) {
          ppsVar1[iVar9] = ppsVar1[iVar10];
          iVar10 = iVar10 + -1;
          iVar7 = iVar9 + -1;
        }
        iVar9 = iVar7 + 1;
      } while (iVar7 < iVar10);
      iVar10 = iVar10 + 1;
    }
    std::vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::resize
              (&this->m_methods_dynamic,(long)iVar10,(value_type)0x0);
  }
  ppsVar3 = (this->m_threads_static).
            super__Vector_base<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->m_threads_static).
                super__Vector_base<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar3;
  if ((uVar5 & 0x7fffffff8) != 0) {
    lVar8 = (long)(int)(uVar5 >> 3) + 1;
    do {
      this_01 = ppsVar3[lVar8 + -2];
      if ((((*(byte *)((long)(&(this_01->super_sc_process_b).super_sc_object + 2) + 0x38) & 1) == 0)
          && (*(long *)((long)(&(this_01->super_sc_process_b).super_sc_object + 2) + 0x18) == 0)) &&
         (*(trigger_t *)((long)(&(this_01->super_sc_process_b).super_sc_object + 3) + 0x10) ==
          STATIC)) {
        if (sc_curr_simcontext == (sc_simcontext *)0x0) {
          psVar6 = (sc_simcontext *)operator_new(0x168);
          sc_simcontext::sc_simcontext(psVar6);
          sc_curr_simcontext = psVar6;
          sc_default_global_context = psVar6;
        }
        if ((sc_thread_handle)(sc_curr_simcontext->m_curr_proc_info).process_handle == this_01) {
          sc_process_b::report_immediate_self_notification(&this_01->super_sc_process_b);
        }
        else if ((this_01->m_wait_cycle_n < 1) ||
                (*(process_throw_type *)(&(this_01->super_sc_process_b).super_sc_object + 3) !=
                 THROW_NONE)) {
          if ((*(uint *)((long)(&(this_01->super_sc_process_b).super_sc_object + 2) + 0x38) & 4) ==
              0) {
            psVar2 = ((this_01->super_sc_process_b).super_sc_object.m_simc)->m_runnable;
            (this_01->super_sc_process_b).m_runnable_p = (sc_process_b *)0xdb;
            (psVar2->m_threads_push_tail->super_sc_process_b).m_runnable_p =
                 &this_01->super_sc_process_b;
            psVar2->m_threads_push_tail = this_01;
          }
          else {
            (this_01->super_sc_process_b).m_state =
                 *(uint *)((long)(&(this_01->super_sc_process_b).super_sc_object + 2) + 0x38) | 2;
          }
        }
        else {
          this_01->m_wait_cycle_n = this_01->m_wait_cycle_n + -1;
        }
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  ppsVar3 = (this->m_threads_dynamic).
            super__Vector_base<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar10 = (int)((ulong)((long)(this->m_threads_dynamic).
                               super__Vector_base<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar3) >> 3);
  if (iVar10 == 0) {
    return;
  }
  if (0 < iVar10) {
    iVar10 = iVar10 + -1;
    iVar9 = 0;
    do {
      bVar4 = sc_thread_process::trigger_dynamic(ppsVar3[iVar9],this);
      iVar7 = iVar9;
      if (bVar4) {
        ppsVar3[iVar9] = ppsVar3[iVar10];
        iVar7 = iVar9 + -1;
        iVar10 = iVar10 + -1;
      }
      iVar9 = iVar7 + 1;
    } while (iVar7 < iVar10);
    iVar10 = iVar10 + 1;
  }
  std::vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>::resize
            (&this->m_threads_dynamic,(long)iVar10,(value_type)0x0);
  return;
}

Assistant:

void
sc_event::trigger()
{
    m_trigger_stamp = m_simc->change_stamp();
    m_notify_type = NONE;
    m_delta_event_index = -1;
    m_timed = 0;

    int       last_i; // index of last element in vector now accessing.
    int       size;   // size of vector now accessing.


    // trigger the static sensitive methods

    if( ( size = m_methods_static.size() ) != 0 )
    {
        sc_method_handle* l_methods_static = &m_methods_static[0];
        int i = size - 1;
        do {
            sc_method_handle method_h = l_methods_static[i];
            method_h->trigger_static();
        } while( -- i >= 0 );
    }

    // trigger the dynamic sensitive methods


    if( ( size = m_methods_dynamic.size() ) != 0 )
    {
	last_i = size - 1;
	sc_method_handle* l_methods_dynamic = &m_methods_dynamic[0];
	for ( int i = 0; i <= last_i; i++ )
	{
	    sc_method_handle method_h = l_methods_dynamic[i];
	    if ( method_h->trigger_dynamic( this ) )
	    {
		l_methods_dynamic[i] = l_methods_dynamic[last_i];
		last_i--;
		i--;
	    }
	}
        m_methods_dynamic.resize(last_i+1);
    }


    // trigger the static sensitive threads

    if( ( size = m_threads_static.size() ) != 0 )
    {
        sc_thread_handle* l_threads_static = &m_threads_static[0];
        int i = size - 1;
        do {
            sc_thread_handle thread_h = l_threads_static[i];
            thread_h->trigger_static();
        } while( -- i >= 0 );
    }

    // trigger the dynamic sensitive threads

    if( ( size = m_threads_dynamic.size() ) != 0 )
    {
	last_i = size - 1;
	sc_thread_handle* l_threads_dynamic = &m_threads_dynamic[0];
	for ( int i = 0; i <= last_i; i++ )
	{
	    sc_thread_handle thread_h = l_threads_dynamic[i];
	    if ( thread_h->trigger_dynamic( this ) )
	    {
		l_threads_dynamic[i] = l_threads_dynamic[last_i];
		i--;
		last_i--;
	    }
	}
        m_threads_dynamic.resize(last_i+1);
    }
}